

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeHolder::detach(CodeHolder *this,CodeEmitter *emitter)

{
  uint8_t uVar1;
  CodeEmitter *pCVar2;
  Error EVar3;
  CodeEmitter **ppCVar4;
  
  if (emitter == (CodeEmitter *)0x0) {
    EVar3 = 3;
  }
  else {
    EVar3 = 4;
    if (emitter->_code == this) {
      uVar1 = emitter->_type;
      EVar3 = 0;
      if (emitter->_destroyed == '\0') {
        if (uVar1 == '\x01') {
          (*emitter->_vptr_CodeEmitter[0x10])(emitter);
        }
        EVar3 = (*emitter->_vptr_CodeEmitter[3])(emitter,this);
      }
      if (uVar1 == '\x01') {
        this->_cgAsm = (Assembler *)0x0;
      }
      ppCVar4 = &this->_emitters;
      while( true ) {
        pCVar2 = *ppCVar4;
        if (pCVar2 == (CodeEmitter *)0x0) {
          detach();
        }
        if (pCVar2 == emitter) break;
        ppCVar4 = &pCVar2->_nextEmitter;
      }
      *ppCVar4 = emitter->_nextEmitter;
      emitter->_code = (CodeHolder *)0x0;
      emitter->_nextEmitter = (CodeEmitter *)0x0;
    }
  }
  return EVar3;
}

Assistant:

Error CodeHolder::detach(CodeEmitter* emitter) noexcept {
  if (!emitter)
    return DebugUtils::errored(kErrorInvalidArgument);

  if (emitter->_code != this)
    return DebugUtils::errored(kErrorInvalidState);

  uint32_t type = emitter->getType();
  Error err = kErrorOk;

  // NOTE: We always detach if we were asked to, if error happens during
  // `emitter->onDetach()` we just propagate it, but the CodeEmitter will
  // be detached.
  if (!emitter->_destroyed) {
    if (type == CodeEmitter::kTypeAssembler)
      static_cast<Assembler*>(emitter)->sync();
    err = emitter->onDetach(this);
  }

  // Special case - detach `Assembler`.
  if (type == CodeEmitter::kTypeAssembler)
    _cgAsm = nullptr;

  // Remove from a single-linked list of `CodeEmitter`s.
  CodeEmitter** pPrev = &_emitters;
  for (;;) {
    ASMJIT_ASSERT(*pPrev != nullptr);
    CodeEmitter* cur = *pPrev;

    if (cur == emitter) {
      *pPrev = emitter->_nextEmitter;
      break;
    }

    pPrev = &cur->_nextEmitter;
  }

  emitter->_code = nullptr;
  emitter->_nextEmitter = nullptr;

  return err;
}